

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  long lVar2;
  bool bVar3;
  GLuint bufferId;
  GLuint local_2c;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    this->m_bufferTarget = BufferWriteTests::init::bufferTargets[lVar2];
    local_2c = 0;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&local_2c);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,local_2c);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_2c);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER
		};
		const int targets = DE_LENGTH_OF_ARRAY(bufferTargets);

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}